

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::DynamicViewportIndex::checkResults
          (DynamicViewportIndex *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  bool bVar1;
  reference pvVar2;
  uint local_60;
  uint uStack_5c;
  bool result;
  GLint expected_value;
  GLuint x;
  GLuint y;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> texture_data;
  bool local_25;
  GLuint index;
  bool check_result;
  GLuint draw_call_index_local;
  texture *param_2_local;
  texture *texture_0_local;
  DynamicViewportIndex *this_local;
  
  local_25 = true;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)local_48,0x4000);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_48,0);
  Utils::texture::get(texture_0,0x8d94,0x1404,pvVar2);
  expected_value = 0;
  do {
    if (3 < (uint)expected_value) {
LAB_0170f404:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48)
      ;
      return local_25;
    }
    for (uStack_5c = 0; uStack_5c < 4; uStack_5c = uStack_5c + 1) {
      local_60 = 0xffffffff;
      if (texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_ <= draw_call_index) {
        local_60 = texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,0);
      bVar1 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,uStack_5c,expected_value,local_60,pvVar2);
      if (!bVar1) {
        local_25 = false;
        goto LAB_0170f404;
      }
      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    expected_value = expected_value + 1;
  } while( true );
}

Assistant:

bool DynamicViewportIndex::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										GLuint			draw_call_index)
{
	bool   check_result = true;
	GLuint index		= 0;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			GLint expected_value = -1;
			if (index <= draw_call_index)
			{
				expected_value = index;
			}

			bool result = checkRegionR32I(x, y, expected_value, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}

			index += 1;
		}
	}

end:
	return check_result;
}